

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractlistmodel.cpp
# Opt level: O0

void QtMWidgets::AbstractListModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  int *result;
  AbstractListModel *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      dataChanged((AbstractListModel *)_o,*_a[1],*_a[2]);
      break;
    case 1:
      modelReset((AbstractListModel *)_o);
      break;
    case 2:
      rowsInserted((AbstractListModel *)_o,*_a[1],*_a[2]);
      break;
    case 3:
      rowsRemoved((AbstractListModel *)_o,*_a[1],*_a[2]);
      break;
    case 4:
      rowsMoved((AbstractListModel *)_o,*_a[1],*_a[2],*_a[3]);
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == dataChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == modelReset && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == rowsInserted && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == rowsRemoved && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
            *puVar1 = 3;
          }
          else {
            pcVar2 = *_a[1];
            if (pcVar2 == rowsMoved && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
              *puVar1 = 4;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void QtMWidgets::AbstractListModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractListModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->modelReset(); break;
        case 2: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (AbstractListModel::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::dataChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::modelReset)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::rowsInserted)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::rowsRemoved)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)(int , int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::rowsMoved)) {
                *result = 4;
                return;
            }
        }
    }
}